

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall sznet::net::Connector::retry(Connector *this,sz_sock sockfd)

{
  EventLoop *this_00;
  int iVar1;
  self *psVar2;
  LogStream *this_01;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_1060 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1048 [503];
  undefined1 local_90 [12];
  undefined1 local_80 [12];
  TimerCallback local_70;
  string local_50;
  
  sockets::sz_closesocket(sockfd);
  this->m_state = kDisconnected;
  if (this->m_connect == true) {
    if (g_logLevel < 3) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_90,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_90._0_8_;
      file.m_size = local_90._8_4_;
      Logger::Logger((Logger *)local_1060,file,0xdc);
      psVar2 = LogStream::operator<<
                         ((LogStream *)(local_1060 + 8),"Connector::retry - Retry connecting to ");
      InetAddress::toIpPort_abi_cxx11_(&local_50,&this->m_serverAddr);
      psVar2 = LogStream::operator<<(psVar2,&local_50);
      psVar2 = LogStream::operator<<(psVar2," in ");
      this_01 = LogStream::operator<<(psVar2,this->m_retryDelayMs);
      LogStream::operator<<(this_01," milliseconds. ");
      std::__cxx11::string::~string((string *)&local_50);
      Logger::~Logger((Logger *)local_1060);
    }
    this_00 = this->m_loop;
    iVar1 = this->m_retryDelayMs;
    std::__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::Connector,void>
              ((__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (__weak_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_1060._0_8_ = startInLoop;
    local_1060._8_8_ = 0;
    local_1060._16_8_ = local_50._M_dataplus._M_p;
    a_Stack_1048[0]._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length;
    local_50._M_dataplus._M_p = (pointer)0x0;
    local_50._M_string_length = 0;
    std::function<void()>::
    function<std::_Bind<void(sznet::net::Connector::*(std::shared_ptr<sznet::net::Connector>))()>,void>
              ((function<void()> *)&local_70,
               (_Bind<void_(sznet::net::Connector::*(std::shared_ptr<sznet::net::Connector>))()> *)
               local_1060);
    EventLoop::runAfter(this_00,(double)iVar1 / 1000.0,&local_70);
    std::_Function_base::~_Function_base(&local_70.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1048);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
    iVar1 = this->m_retryDelayMs * 2;
    if (29999 < iVar1) {
      iVar1 = 30000;
    }
    this->m_retryDelayMs = iVar1;
  }
  else if (g_logLevel < 2) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_80,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_80._0_8_;
    file_00.m_size = local_80._8_4_;
    Logger::Logger((Logger *)local_1060,file_00,0xe4,DEBUG,"retry");
    LogStream::operator<<((LogStream *)(local_1060 + 8),"do not connect");
    Logger::~Logger((Logger *)local_1060);
  }
  return;
}

Assistant:

void Connector::retry(sockets::sz_sock sockfd)
{
	sockets::sz_closesocket(sockfd);
	setState(kDisconnected);
	if (m_connect)
	{
		LOG_INFO << "Connector::retry - Retry connecting to " << m_serverAddr.toIpPort()
			<< " in " << m_retryDelayMs << " milliseconds. ";
		m_loop->runAfter(m_retryDelayMs / 1000.0, std::bind(&Connector::startInLoop, shared_from_this()));
		// �����ӳټӱ����������������ӳ�
		m_retryDelayMs = std::min(m_retryDelayMs * 2, kMaxRetryDelayMs);
	}
	else
	{
		LOG_DEBUG << "do not connect";
	}
}